

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SetPrototypeAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<2UL> *argAction;
  TTDVar pvVar2;
  RecyclableObject *pRVar3;
  ScriptContext *pSVar4;
  RecyclableObject *newPrototype;
  RecyclableObject *__obj_1;
  Var proto;
  RecyclableObject *__obj;
  Var var;
  JsRTDoubleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)58>
                          (evt);
    pvVar2 = GetVarItem_0<2ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
    if ((__obj != (RecyclableObject *)0x0) &&
       (BVar1 = Js::JavascriptOperators::IsObject(__obj), BVar1 != 0)) {
      pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
      pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
      if (pSVar4 != scriptContext) {
        __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
      pvVar2 = GetVarItem_1<2ul>(argAction);
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
      if ((__obj_1 != (RecyclableObject *)0x0) &&
         (BVar1 = Js::JavascriptOperators::IsObjectOrNull(__obj_1), BVar1 != 0)) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj_1);
        pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
        if (pSVar4 != scriptContext) {
          __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
        pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
        newPrototype = Js::VarTo<Js::RecyclableObject>(__obj_1);
        Js::JavascriptObject::ChangePrototype(pRVar3,newPrototype,true,scriptContext);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void SetPrototypeAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::SetPrototypeActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var proto = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT_OR_NULL(proto, ctx);

            Js::JavascriptObject::ChangePrototype(Js::VarTo<Js::RecyclableObject>(var), Js::VarTo<Js::RecyclableObject>(proto), true, ctx);
        }